

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::RemoveAllMarkers(ChBody *this)

{
  pointer psVar1;
  ulong uVar2;
  long lVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  psVar4 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    lVar3 = -0x10 - (long)psVar4;
    auVar8 = vpbroadcastq_avx512f();
    auVar8 = vpsrlq_avx512f(auVar8,4);
    uVar5 = 0;
    do {
      auVar9 = vpbroadcastq_avx512f();
      uVar6 = uVar5 + 8;
      auVar9 = vporq_avx512f(auVar9,auVar7);
      uVar2 = vpcmpuq_avx512f(auVar9,auVar8,2);
      auVar9 = vpgatherdq_avx512f(*(undefined4 *)
                                   ((long)&(psVar4->
                                           super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_refcount._M_pi + uVar5));
      auVar10._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar9._8_8_;
      auVar10._0_8_ = (ulong)((byte)uVar2 & 1) * auVar9._0_8_;
      auVar10._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar9._16_8_;
      auVar10._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar9._24_8_;
      auVar10._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar9._32_8_;
      auVar10._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar9._40_8_;
      auVar10._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar9._48_8_;
      auVar10._56_8_ = (uVar2 >> 7) * auVar9._56_8_;
      psVar4 = psVar4 + 8;
      vpscatterqq_avx512f(ZEXT864(400) + auVar10,uVar2,ZEXT1664((undefined1  [16])0x0));
      uVar5 = uVar6;
    } while ((((ulong)((long)psVar1 + lVar3) >> 4) + 8 & 0xfffffffffffffff8) != uVar6);
    std::
    vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
    clear(&this->marklist);
    return;
  }
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  clear(&this->marklist);
  return;
}

Assistant:

void ChBody::RemoveAllMarkers() {
    for (auto& marker : marklist) {
        marker->SetBody(NULL);
    }
    marklist.clear();
}